

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,ConstSchema constant)

{
  PointerReader reader;
  ElementSize expectedElementSize;
  byte bVar1;
  Which WVar2;
  StructSchema schema;
  undefined2 uVar3;
  StructDataBitCount SVar4;
  SegmentReader *pSVar5;
  bool bVar6;
  undefined4 uVar7;
  Fault f;
  Reader value;
  Type type;
  undefined1 local_148 [8];
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_140;
  StructReader local_f8;
  Type local_c8;
  Type local_b8;
  ListReader local_a8;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Schema local_60;
  PointerReader local_58;
  
  this->type = VOID;
  local_60 = constant.super_Schema.raw;
  local_c8 = ConstSchema::getType((ConstSchema *)&local_60);
  Schema::getProto((Reader *)local_148,&local_60);
  local_a8.segment = (SegmentReader *)&(aStack_140.listValue.reader.segment)->readLimiter;
  if (aStack_140._28_2_ < 5) {
    local_a8.segment = (SegmentReader *)0x0;
  }
  if (aStack_140._28_2_ < 5) {
    local_148._0_4_ = UNKNOWN;
    local_148._4_4_ = 0;
    local_b8.field_4.scopeId._0_4_ = 0;
    local_b8.field_4.scopeId._4_4_ = 0;
    local_a8.capTable._0_4_ = 0x7fffffff;
  }
  else {
    local_b8.field_4.scopeId._0_4_ = aStack_140.intValue._0_4_;
    local_b8.field_4.scopeId._4_4_ = aStack_140.intValue._4_4_;
    local_a8.capTable._0_4_ = aStack_140._32_4_;
  }
  local_b8.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)local_148._4_4_;
  local_b8._6_2_ = SUB42(local_148._4_4_,2);
  local_b8.baseType = (short)local_148._0_4_;
  local_b8.listDepth = (char)((uint)local_148._0_4_ >> 0x10);
  local_b8.isImplicitParam = (bool)(char)((uint)local_148._0_4_ >> 0x18);
  capnp::_::PointerReader::getStruct(&local_f8,(PointerReader *)&local_b8,(word *)0x0);
  WVar2 = LIST;
  if (local_c8.listDepth == '\0') {
    WVar2 = local_c8.baseType;
  }
  switch(WVar2) {
  case VOID:
    local_148._0_4_ = VOID;
    operator=(this,(Reader *)local_148);
    break;
  case BOOL:
    if (local_f8.dataSize < 0x11) {
      bVar1 = 0;
    }
    else {
      bVar1 = *(byte *)((long)local_f8.data + 2) & 1;
    }
    local_148._0_4_ = BOOL;
    aStack_140.field12[0] = bVar1;
    operator=(this,(Reader *)local_148);
    break;
  case INT8:
    if (local_f8.dataSize < 0x18) {
      aStack_140.intValue = (int64_t)(char *)0x0;
    }
    else {
      aStack_140.intValue = (int64_t)*(char *)((long)local_f8.data + 2);
    }
    local_148._0_4_ = INT;
    operator=(this,(Reader *)local_148);
    break;
  case INT16:
    if (local_f8.dataSize < 0x20) {
      aStack_140.intValue = (int64_t)(char *)0x0;
    }
    else {
      aStack_140.intValue = (int64_t)*(short *)((long)local_f8.data + 2);
    }
    local_148._0_4_ = INT;
    operator=(this,(Reader *)local_148);
    break;
  case INT32:
    if (local_f8.dataSize < 0x40) {
      aStack_140.intValue = (int64_t)(char *)0x0;
    }
    else {
      aStack_140.intValue = (int64_t)*(int *)((long)local_f8.data + 4);
    }
    local_148._0_4_ = INT;
    operator=(this,(Reader *)local_148);
    break;
  case INT64:
    if (local_f8.dataSize < 0x80) {
      aStack_140.intValue = (int64_t)(char *)0x0;
    }
    else {
      aStack_140.intValue = *(undefined8 *)((long)local_f8.data + 8);
    }
    local_148._0_4_ = INT;
    operator=(this,(Reader *)local_148);
    break;
  case UINT8:
    if (local_f8.dataSize < 0x18) {
      aStack_140.intValue = (int64_t)(char *)0x0;
    }
    else {
      aStack_140.intValue = (int64_t)*(byte *)((long)local_f8.data + 2);
    }
    local_148._0_4_ = UINT;
    operator=(this,(Reader *)local_148);
    break;
  case UINT16:
    if (local_f8.dataSize < 0x20) {
      aStack_140.intValue = (int64_t)(char *)0x0;
    }
    else {
      aStack_140.intValue = (int64_t)*(ushort *)((long)local_f8.data + 2);
    }
    local_148._0_4_ = UINT;
    operator=(this,(Reader *)local_148);
    break;
  case UINT32:
    if (local_f8.dataSize < 0x40) {
      aStack_140.intValue = (int64_t)(char *)0x0;
    }
    else {
      aStack_140.intValue = (int64_t)*(uint *)((long)local_f8.data + 4);
    }
    local_148._0_4_ = UINT;
    operator=(this,(Reader *)local_148);
    break;
  case UINT64:
    if (local_f8.dataSize < 0x80) {
      aStack_140.intValue = (int64_t)(char *)0x0;
    }
    else {
      aStack_140.intValue = *(undefined8 *)((long)local_f8.data + 8);
    }
    local_148._0_4_ = UINT;
    operator=(this,(Reader *)local_148);
    break;
  case FLOAT32:
    aStack_140.intValue = (int64_t)(char *)0x0;
    if (0x3f < local_f8.dataSize) {
      aStack_140.floatValue = (double)*(float *)((long)local_f8.data + 4);
    }
    local_148._0_4_ = FLOAT;
    operator=(this,(Reader *)local_148);
    break;
  case FLOAT64:
    aStack_140.intValue._0_4_ = 0;
    aStack_140.intValue._4_4_ = 0;
    if (0x7f < local_f8.dataSize) {
      aStack_140.intValue._0_4_ = (undefined4)*(undefined8 *)((long)local_f8.data + 8);
      aStack_140.intValue._4_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)local_f8.data + 8) >> 0x20);
    }
    local_148._0_4_ = FLOAT;
    operator=(this,(Reader *)local_148);
    break;
  case TEXT:
    bVar6 = local_f8.pointerCount == 0;
    local_a8.segment = (SegmentReader *)local_f8.pointers;
    if (bVar6) {
      local_a8.segment = (SegmentReader *)0x0;
    }
    local_a8.capTable._0_4_ = 0x7fffffff;
    if (!bVar6) {
      local_a8.capTable._0_4_ = local_f8.nestingLimit;
    }
    uVar7 = 0;
    local_b8._4_4_ = 0;
    local_b8.field_4.scopeId._0_4_ = 0;
    local_b8.field_4.scopeId._4_4_ = 0;
    if (!bVar6) {
      uVar7 = local_f8.segment._0_4_;
      local_b8._4_4_ = local_f8.segment._4_4_;
      local_b8.field_4.scopeId._0_4_ = local_f8.capTable._0_4_;
      local_b8.field_4.scopeId._4_4_ = local_f8.capTable._4_4_;
    }
    local_b8.baseType = (short)uVar7;
    local_b8.listDepth = (char)((uint)uVar7 >> 0x10);
    local_b8.isImplicitParam = (bool)(char)((uint)uVar7 >> 0x18);
    aStack_140.textValue.super_StringPtr.content =
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_b8,(void *)0x0,0);
    local_148._0_4_ = TEXT;
    operator=(this,(Reader *)local_148);
    break;
  case DATA:
    bVar6 = local_f8.pointerCount == 0;
    local_a8.segment = (SegmentReader *)local_f8.pointers;
    if (bVar6) {
      local_a8.segment = (SegmentReader *)0x0;
    }
    local_a8.capTable._0_4_ = 0x7fffffff;
    if (!bVar6) {
      local_a8.capTable._0_4_ = local_f8.nestingLimit;
    }
    uVar7 = 0;
    local_b8._4_4_ = 0;
    local_b8.field_4.scopeId._0_4_ = 0;
    local_b8.field_4.scopeId._4_4_ = 0;
    if (!bVar6) {
      uVar7 = local_f8.segment._0_4_;
      local_b8._4_4_ = local_f8.segment._4_4_;
      local_b8.field_4.scopeId._0_4_ = local_f8.capTable._0_4_;
      local_b8.field_4.scopeId._4_4_ = local_f8.capTable._4_4_;
    }
    local_b8.baseType = (short)uVar7;
    local_b8.listDepth = (char)((uint)uVar7 >> 0x10);
    local_b8.isImplicitParam = (bool)(char)((uint)uVar7 >> 0x18);
    aStack_140.dataValue.super_ArrayPtr<const_unsigned_char> =
         capnp::_::PointerReader::getBlob<capnp::Data>((PointerReader *)&local_b8,(void *)0x0,0);
    local_148._0_4_ = DATA;
    operator=(this,(Reader *)local_148);
    break;
  case LIST:
    bVar6 = local_f8.pointerCount == 0;
    pSVar5 = (SegmentReader *)local_f8.pointers;
    if (bVar6) {
      pSVar5 = (SegmentReader *)0x0;
    }
    SVar4 = 0x7fffffff;
    if (!bVar6) {
      SVar4 = local_f8.nestingLimit;
    }
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0;
    if (!bVar6) {
      local_78 = local_f8.segment._0_4_;
      uStack_74 = local_f8.segment._4_4_;
      uStack_70 = local_f8.capTable._0_4_;
      uStack_6c = local_f8.capTable._4_4_;
    }
    aStack_140.listValue.schema.elementType = Type::asList(&local_c8);
    local_58.segment = (SegmentReader *)CONCAT44(uStack_74,local_78);
    local_58.capTable = (CapTableReader *)CONCAT44(uStack_6c,uStack_70);
    WVar2 = LIST;
    if (((undefined1  [16])aStack_140.textValue.super_StringPtr.content & (undefined1  [16])0xff0000
        ) == (undefined1  [16])0x0) {
      WVar2 = aStack_140._0_2_;
    }
    local_58.pointer = (WirePointer *)pSVar5;
    local_58.nestingLimit = SVar4;
    expectedElementSize = anon_unknown_71::elementSizeFor(WVar2);
    capnp::_::PointerReader::getList(&local_a8,&local_58,expectedElementSize,(word *)0x0);
    local_148._0_4_ = LIST;
    aStack_140.listValue.reader.capTable =
         (CapTableReader *)CONCAT44(local_a8.capTable._4_4_,local_a8.capTable._0_4_);
    aStack_140.listValue.reader.segment = local_a8.segment;
    aStack_140.listValue.reader.ptr = local_a8.ptr;
    aStack_140.listValue.reader.elementCount = local_a8.elementCount;
    aStack_140.listValue.reader.step = local_a8.step;
    aStack_140.listValue.reader.structDataSize = local_a8.structDataSize;
    aStack_140.listValue.reader.structPointerCount = local_a8.structPointerCount;
    aStack_140.listValue.reader.elementSize = local_a8.elementSize;
    aStack_140.field12[0x37] = local_a8._39_1_;
    aStack_140._56_8_ = local_a8._40_8_;
    local_b8 = (Type)aStack_140.textValue.super_StringPtr.content;
    operator=(this,(Reader *)local_148);
    break;
  case ENUM:
    aStack_140.enumValue.schema = Type::asEnum(&local_c8);
    if (local_f8.dataSize < 0x20) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined2 *)((long)local_f8.data + 2);
    }
    local_148._0_4_ = ENUM;
    aStack_140.enumValue.value = uVar3;
    operator=(this,(Reader *)local_148);
    break;
  case STRUCT:
    bVar6 = local_f8.pointerCount != 0;
    local_a8.segment = (SegmentReader *)0x0;
    if (bVar6) {
      local_a8.segment = (SegmentReader *)local_f8.pointers;
    }
    local_a8.capTable._0_4_ = 0x7fffffff;
    if (bVar6) {
      local_a8.capTable._0_4_ = local_f8.nestingLimit;
    }
    uVar7 = 0;
    local_b8._4_4_ = 0;
    local_b8.field_4.scopeId._0_4_ = 0;
    local_b8.field_4.scopeId._4_4_ = 0;
    if (bVar6) {
      uVar7 = local_f8.segment._0_4_;
      local_b8._4_4_ = local_f8.segment._4_4_;
      local_b8.field_4.scopeId._0_4_ = local_f8.capTable._0_4_;
      local_b8.field_4.scopeId._4_4_ = local_f8.capTable._4_4_;
    }
    local_b8.baseType = (short)uVar7;
    local_b8.listDepth = (char)((uint)uVar7 >> 0x10);
    local_b8.isImplicitParam = (bool)(char)((uint)uVar7 >> 0x18);
    schema = Type::asStruct(&local_c8);
    reader._28_4_ = local_a8.capTable._4_4_;
    reader.nestingLimit = local_a8.capTable._0_4_;
    reader.pointer = (WirePointer *)local_a8.segment;
    reader._0_16_ = local_b8;
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
              (&aStack_140.structValue,reader,schema);
    local_148._0_4_ = STRUCT;
    operator=(this,(Reader *)local_148);
    break;
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              ((Fault *)local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x5bc,FAILED,(char *)0x0,"\"Constants can\'t have interface type.\"",
               (char (*) [37])"Constants can\'t have interface type.");
    kj::_::Debug::Fault::fatal((Fault *)local_148);
  case ANY_POINTER:
    bVar6 = local_f8.pointerCount != 0;
    aStack_140.listValue.reader.segment = (SegmentReader *)0x0;
    if (bVar6) {
      aStack_140.listValue.reader.segment = (SegmentReader *)local_f8.pointers;
    }
    SVar4 = 0x7fffffff;
    if (bVar6) {
      SVar4 = local_f8.nestingLimit;
    }
    aStack_140.intValue._0_4_ = 0;
    aStack_140.intValue._4_4_ = 0;
    aStack_140.textValue.super_StringPtr.content.size_._0_4_ = 0;
    aStack_140.textValue.super_StringPtr.content.size_._4_4_ = 0;
    if (bVar6) {
      aStack_140.uintValue._0_4_ = local_f8.segment._0_4_;
      aStack_140.intValue._4_4_ = local_f8.segment._4_4_;
      aStack_140.textValue.super_StringPtr.content.size_._0_4_ = local_f8.capTable._0_4_;
      aStack_140.textValue.super_StringPtr.content.size_._4_4_ = local_f8.capTable._4_4_;
    }
    local_148._0_4_ = ANY_POINTER;
    aStack_140.anyPointerValue.reader.nestingLimit = SVar4;
    operator=(this,(Reader *)local_148);
    break;
  default:
    goto switchD_0018de94_default;
  }
  if ((local_148._0_4_ == CAPABILITY) && (aStack_140._8_8_ != (RawBrandedSchema *)0x0)) {
    (*(code *)(aStack_140.anyPointerValue.reader.segment)->arena->_vptr_Arena)
              (aStack_140.intValue,
               (long)&(aStack_140.structValue.reader.segment)->arena +
               (long)((RawSchema *)(aStack_140.structValue.reader.segment)->arena)[-1].defaultBrand.
                     lazyInitializer);
  }
switchD_0018de94_default:
  return;
}

Assistant:

DynamicValue::Reader::Reader(ConstSchema constant): type(VOID) {
  auto type = constant.getType();
  auto value = constant.getProto().getConst().getValue();
  switch (type.which()) {
    case schema::Type::VOID: *this = capnp::VOID; break;
    case schema::Type::BOOL: *this = value.getBool(); break;
    case schema::Type::INT8: *this = value.getInt8(); break;
    case schema::Type::INT16: *this = value.getInt16(); break;
    case schema::Type::INT32: *this = value.getInt32(); break;
    case schema::Type::INT64: *this = value.getInt64(); break;
    case schema::Type::UINT8: *this = value.getUint8(); break;
    case schema::Type::UINT16: *this = value.getUint16(); break;
    case schema::Type::UINT32: *this = value.getUint32(); break;
    case schema::Type::UINT64: *this = value.getUint64(); break;
    case schema::Type::FLOAT32: *this = value.getFloat32(); break;
    case schema::Type::FLOAT64: *this = value.getFloat64(); break;
    case schema::Type::TEXT: *this = value.getText(); break;
    case schema::Type::DATA: *this = value.getData(); break;

    case schema::Type::ENUM:
      *this = DynamicEnum(type.asEnum(), value.getEnum());
      break;

    case schema::Type::STRUCT:
      *this = value.getStruct().getAs<DynamicStruct>(type.asStruct());
      break;

    case schema::Type::LIST:
      *this = value.getList().getAs<DynamicList>(type.asList());
      break;

    case schema::Type::ANY_POINTER:
      *this = value.getAnyPointer();
      break;

    case schema::Type::INTERFACE:
      KJ_FAIL_ASSERT("Constants can't have interface type.");
  }
}